

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O3

void SoPlex_getLowerReal(void *soplex,double *lb,int dim)

{
  ulong uVar1;
  Vector lbvec;
  VectorBase<double> local_38;
  
  ::soplex::VectorBase<double>::VectorBase(&local_38,dim);
  ::soplex::SPxLPBase<double>::getLowerUnscaled
            (*(SPxLPBase<double> **)((long)soplex + 0x1ce0),&local_38);
  if (dim < 1) {
    if (local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    uVar1 = 0;
    do {
      lb[uVar1] = local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)dim != uVar1);
  }
  operator_delete(local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

void SoPlex_getLowerReal(void* soplex, double* lb, int dim)
{
   SoPlex* so = (SoPlex*)(soplex);
   Vector lbvec(dim);

   so->getLowerReal(lbvec);

   for(int i = 0; i < dim; ++i)
      lb[i] = lbvec[i];
}